

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BvhNode.cpp
# Opt level: O3

void __thiscall BVH_Node::Release(BVH_Node *this,Object *node)

{
  long *plVar1;
  
  if (node != (Object *)0x0) {
    plVar1 = (long *)__dynamic_cast(node,&Object::typeinfo,&typeinfo,0);
    if ((char)plVar1[6] == '\0') {
      Release(this,(Object *)plVar1[4]);
      Release(this,(Object *)plVar1[5]);
    }
    if (*(char *)((long)plVar1 + 0x31) == '\0') {
      (**(code **)(*plVar1 + 8))(plVar1);
      return;
    }
  }
  return;
}

Assistant:

void
BVH_Node::Release(Object *node)
{
    if(node == nullptr) {
        return;
    }

    BVH_Node *_node_bvh = dynamic_cast<BVH_Node *>(node);
    if(!_node_bvh->IsLeaf()) {
        Release(_node_bvh->GetNodeLeft());
        Release(_node_bvh->GetNodeRight());
    }
    
    if(!_node_bvh->IsRoot()) {
        safe_delete(_node_bvh);
    }
}